

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O2

void pub0_pipe_send_cb(void *arg)

{
  nni_aio *aio;
  long lVar1;
  nng_err nVar2;
  int iVar3;
  nni_msg *in_RAX;
  nni_msg *m;
  nni_mtx *mtx;
  nni_msg *local_28;
  nni_msg *msg;
  
  lVar1 = *(long *)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x60);
  local_28 = in_RAX;
  nVar2 = nni_aio_result(aio);
  if (nVar2 != NNG_OK) {
    m = nni_aio_get_msg(aio);
    nni_msg_free(m);
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_pipe_close(*arg);
    return;
  }
  mtx = (nni_mtx *)(lVar1 + 0x18);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x58) == '\x01') {
    nni_mtx_unlock(mtx);
    return;
  }
  iVar3 = nni_lmq_get((nni_lmq *)((long)arg + 0x10),&local_28);
  if (iVar3 == 0) {
    nni_aio_set_msg(aio,local_28);
    nni_pipe_send(*arg,aio);
  }
  else {
    *(undefined1 *)((long)arg + 0x59) = 0;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
pub0_pipe_send_cb(void *arg)
{
	pub0_pipe *p    = arg;
	pub0_sock *sock = p->pub;
	nni_msg   *msg;

	if (nni_aio_result(&p->aio_send) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	nni_mtx_lock(&sock->mtx);
	if (p->closed) {
		nni_mtx_unlock(&sock->mtx);
		return;
	}
	if (nni_lmq_get(&p->sendq, &msg) == 0) {
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		p->busy = false;
	}
	nni_mtx_unlock(&sock->mtx);
}